

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

uchar FSE_decodeSymbolFast(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  uchar uVar1;
  ushort uVar2;
  void *pvVar3;
  size_t sVar4;
  
  sVar4 = DStatePtr->state;
  pvVar3 = DStatePtr->table;
  uVar2 = *(ushort *)((long)pvVar3 + sVar4 * 4);
  uVar1 = *(uchar *)((long)pvVar3 + sVar4 * 4 + 2);
  sVar4 = BIT_readBitsFast(bitD,(uint)*(byte *)((long)pvVar3 + sVar4 * 4 + 3));
  DStatePtr->state = sVar4 + uVar2;
  return uVar1;
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbolFast(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBitsFast(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}